

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a4_aux.c
# Opt level: O3

void stretch_sprite(ALLEGRO_BITMAP *bmp,ALLEGRO_BITMAP *sprite,int x,int y,int w,int h)

{
  int iVar1;
  int iVar2;
  ALLEGRO_STATE state;
  undefined1 local_430 [1024];
  
  al_store_state(local_430,8);
  al_set_target_bitmap(bmp);
  iVar1 = al_get_bitmap_width(sprite);
  iVar2 = al_get_bitmap_height(sprite);
  al_draw_scaled_bitmap(0,0,(float)iVar1,(float)iVar2,(float)x,(float)y,(float)w,(float)h,sprite,0);
  al_restore_state(local_430);
  return;
}

Assistant:

void stretch_sprite(ALLEGRO_BITMAP *bmp, ALLEGRO_BITMAP *sprite,
		    int x, int y, int w, int h)
{
   ALLEGRO_STATE state;

   al_store_state(&state, ALLEGRO_STATE_TARGET_BITMAP);

   al_set_target_bitmap(bmp);
   al_draw_scaled_bitmap(sprite,
      0, 0, al_get_bitmap_width(sprite), al_get_bitmap_height(sprite),
      x, y, w, h, 0);

   al_restore_state(&state);
}